

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::LoopLayerParams::ByteSizeLong(LoopLayerParams *this)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  
  lVar1 = *(long *)(((ulong)(this->conditionvar_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  if (lVar1 == 0) {
    sVar6 = 0;
  }
  else {
    uVar5 = (uint)lVar1 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar6 = lVar1 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->conditionnetwork_ != (NeuralNetwork *)0x0 &&
      this != (LoopLayerParams *)_LoopLayerParams_default_instance_) {
    sVar3 = NeuralNetwork::ByteSizeLong(this->conditionnetwork_);
    uVar5 = (uint)sVar3 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar6 = sVar6 + sVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->bodynetwork_ != (NeuralNetwork *)0x0 &&
      this != (LoopLayerParams *)_LoopLayerParams_default_instance_) {
    sVar3 = NeuralNetwork::ByteSizeLong(this->bodynetwork_);
    uVar5 = (uint)sVar3 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar6 = sVar6 + sVar3 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
  }
  if (this->maxloopiterations_ != 0) {
    uVar4 = this->maxloopiterations_ | 1;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar6 = sVar6 + ((int)lVar1 * 9 + 0x89U >> 6);
  }
  uVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar4 & 1) != 0) {
    sVar6 = sVar6 + *(long *)((uVar4 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar6;
  return sVar6;
}

Assistant:

size_t LoopLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LoopLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // string conditionVar = 2;
  if (!this->_internal_conditionvar().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_conditionvar());
  }

  // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
  if (this->_internal_has_conditionnetwork()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *conditionnetwork_);
  }

  // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
  if (this->_internal_has_bodynetwork()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *bodynetwork_);
  }

  // uint64 maxLoopIterations = 1;
  if (this->_internal_maxloopiterations() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_maxloopiterations());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}